

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O0

void sysbvm_bytecodeJit_jit(sysbvm_context_t *context,sysbvm_functionBytecode_t *functionBytecode)

{
  byte *pbVar1;
  byte bVar2;
  _Bool _Var3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  sysbvm_tuple_t sVar8;
  size_t sVar9;
  long lVar10;
  sysbvm_gdb_jit_code_entry_t *local_588;
  sysbvm_gdb_jit_code_entry_t *entry;
  uint8_t *entryPointPointer;
  uint8_t *codeExecutablePointer;
  uint8_t *codeWriteablePointer;
  size_t requiredCodeSize;
  size_t objectFileContentSize;
  size_t debugInfoSize;
  size_t unwindInfoSize;
  size_t rodataSectionSize;
  size_t textSectionSize;
  size_t objectFileHeaderSize;
  short local_528;
  byte local_525;
  short sStack_524;
  uint8_t vectorType;
  int16_t vectorIndex_1;
  int16_t decodedOperand;
  uint8_t i_2;
  int16_t vectorIndex;
  uint8_t i_1;
  size_t offsetOperandCount;
  uint8_t destinationOperandCount;
  uint16_t highByte_1;
  uint16_t lowByte_1;
  size_t sStack_510;
  uint8_t i;
  size_t caseCount;
  size_t operandCount;
  uint8_t standardOpcode;
  uint8_t highByte;
  uint8_t lowByte;
  ulong uStack_4f8;
  uint8_t opcode;
  size_t countExtension;
  size_t pc;
  int16_t decodedOperands [64];
  uint8_t *instructions;
  size_t instructionsSize;
  sysbvm_bytecodeJit_t jit;
  sysbvm_functionBytecode_t *functionBytecode_local;
  sysbvm_context_t *context_local;
  
  jit.literalVectorGCRoot = (sysbvm_tuple_t *)functionBytecode;
  sysbvm_bytecodeInterpreter_ensureTablesAreFilled();
  sysbvm_bytecodeJit_initialize((sysbvm_bytecodeJit_t *)&instructionsSize,context);
  jit.context = (sysbvm_context_t *)jit.literalVectorGCRoot[0xb];
  jit.sourcePosition = jit.literalVectorGCRoot[7];
  jit.pcDestinations = (intptr_t *)sysbvm_heap_allocateGCRootTableEntry(&context->heap);
  *jit.pcDestinations = jit.literalVectorGCRoot[5];
  sVar4 = sysbvm_tuple_getSizeInBytes(jit.literalVectorGCRoot[6]);
  lVar5 = jit.literalVectorGCRoot[6] + 0x10;
  memset(&pc,0,0x80);
  jit.compiledProgramEntity = sysbvm_tuple_size_decode(jit.literalVectorGCRoot[2]);
  jit.argumentCount = sysbvm_tuple_size_decode(jit.literalVectorGCRoot[3]);
  jit.captureVectorSize = sysbvm_tuple_getSizeInSlots(jit.literalVectorGCRoot[5]);
  jit.literalCount = sysbvm_tuple_size_decode(jit.literalVectorGCRoot[4]);
  jit.dwarfLineEmissionState.pc = (size_t)malloc(sVar4 << 3);
  memset((void *)jit.dwarfLineEmissionState.pc,0xff,sVar4 << 3);
  sysbvm_jit_prologue((sysbvm_bytecodeJit_t *)&instructionsSize);
  countExtension = 0;
  uStack_4f8 = 0;
  while (countExtension < sVar4) {
    *(size_t *)(jit.dwarfLineEmissionState.pc + countExtension * 8) = jit.instructions.entrySize;
    sysbvm_jit_storePC((sysbvm_bytecodeJit_t *)&instructionsSize,(uint16_t)countExtension);
    sysbvm_bytecodeJit_addSourcePositionRecord
              ((sysbvm_bytecodeJit_t *)&instructionsSize,
               (sysbvm_functionBytecode_t *)jit.literalVectorGCRoot,(uint16_t)countExtension,
               jit.instructions.entrySize);
    sVar9 = countExtension + 1;
    operandCount._7_1_ = *(byte *)(lVar5 + countExtension);
    if (operandCount._7_1_ == 0x1f) {
      lVar10 = countExtension + 2;
      operandCount._6_1_ = *(byte *)(lVar5 + sVar9);
      countExtension = countExtension + 3;
      operandCount._5_1_ = *(byte *)(lVar5 + lVar10);
      uStack_4f8 = uStack_4f8 << 0x10 | (long)(int)((uint)operandCount._5_1_ << 8) |
                   (ulong)operandCount._6_1_;
    }
    else {
      sStack_510 = 0;
      if (operandCount._7_1_ < 0x40) {
        caseCount = (size_t)((int)(uint)operandCount._7_1_ >> 4);
        operandCount._4_1_ = operandCount._7_1_;
      }
      else {
        sVar6 = uStack_4f8 * 0x10 + (long)(int)(operandCount._7_1_ & 0xf);
        caseCount = sVar6;
        if ((operandCount._7_1_ & 0xf0) == 0xe0) {
          caseCount = sVar6 * 2;
          sStack_510 = sVar6;
        }
        caseCount = sysbvm_implicitVariableBytecodeOperandCountTable
                    [(int)(uint)operandCount._7_1_ >> 4] + caseCount;
        operandCount._4_1_ = operandCount._7_1_ & 0xf0;
      }
      uStack_4f8 = 0;
      countExtension = sVar9;
      if (0x3f < caseCount) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeJitCommon.c:487: assertion failure: operandCount < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE"
                  );
      }
      if (sVar4 < countExtension + caseCount * 2) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeJitCommon.c:488: assertion failure: pc + operandCount*2 <= instructionsSize"
                  );
      }
      for (offsetOperandCount._7_1_ = 0; offsetOperandCount._7_1_ < caseCount;
          offsetOperandCount._7_1_ = offsetOperandCount._7_1_ + 1) {
        lVar10 = countExtension + 1;
        pbVar1 = (byte *)(lVar5 + countExtension);
        offsetOperandCount._4_2_ = (ushort)*pbVar1;
        countExtension = countExtension + 2;
        bVar2 = *(byte *)(lVar5 + lVar10);
        offsetOperandCount._2_2_ = (ushort)bVar2;
        decodedOperands[(ulong)offsetOperandCount._7_1_ - 4] = CONCAT11(bVar2,*pbVar1);
      }
      offsetOperandCount._1_1_ =
           sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(operandCount._4_1_);
      sVar9 = sStack_510;
      bVar2 = sysbvm_bytecodeInterpreter_offsetOperandCountForOpcode(operandCount._4_1_);
      _decodedOperand = sVar9 + bVar2;
      for (vectorIndex_1._1_1_ = 0; vectorIndex_1._1_1_ < offsetOperandCount._1_1_;
          vectorIndex_1._1_1_ = vectorIndex_1._1_1_ + 1) {
        if ((decodedOperands[(ulong)vectorIndex_1._1_1_ - 4] & 3U) != 3) {
          sysbvm_error("Bytecode destination operands must be in the local vector.");
        }
        sStack_524 = decodedOperands[(ulong)vectorIndex_1._1_1_ - 4] >> 2;
        if ((-1 < sStack_524) && (jit.literalCount <= (ulong)(long)sStack_524)) {
          sysbvm_error("Bytecode destination operand is beyond the local vector bounds.");
        }
      }
      for (local_525 = offsetOperandCount._1_1_; (ulong)local_525 < caseCount - _decodedOperand;
          local_525 = local_525 + 1) {
        if (0x3f < local_525) {
          sysbvm_error_assertionFailure
                    (
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeJitCommon.c:513: assertion failure: i < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE"
                    );
        }
        local_528 = decodedOperands[(ulong)local_525 - 4];
        objectFileHeaderSize._6_2_ = (short)((uint)(int)local_528 >> 2);
        objectFileHeaderSize._5_1_ = (byte)local_528 & 3;
        switch(objectFileHeaderSize._5_1_) {
        case 0:
          if (jit.compiledProgramEntity <= (ulong)(long)objectFileHeaderSize._6_2_) {
            sysbvm_error("Bytecode operand is beyond the argument vector bounds.");
          }
          break;
        case 1:
          if (jit.argumentCount <= (ulong)(long)objectFileHeaderSize._6_2_) {
            sysbvm_error("Bytecode operand is beyond the capture vector bounds.");
          }
          break;
        case 2:
          if (jit.captureVectorSize <= (ulong)(long)objectFileHeaderSize._6_2_) {
            sysbvm_error("Bytecode operand is beyond the literal vector bounds.");
          }
          break;
        case 3:
          if (jit.literalCount <= (ulong)(long)objectFileHeaderSize._6_2_) {
            sysbvm_error("Bytecode operand is beyond the local vector bounds.");
          }
          break;
        default:
          abort();
        }
      }
      switch(operandCount._4_1_) {
      case 0:
        break;
      case 1:
        sysbvm_jit_breakpoint((sysbvm_bytecodeJit_t *)&instructionsSize);
        break;
      case 2:
        sysbvm_jit_unreachable((sysbvm_bytecodeJit_t *)&instructionsSize);
        break;
      default:
        sysbvm_error("Unsupported bytecode instruction.");
        break;
      case 0x10:
        sysbvm_jit_return((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc);
        break;
      case 0x11:
        if ((int16_t)pc < 0) {
          sysbvm_jit_callWithContextNoResult0
                    ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_gc_safepoint);
        }
        sysbvm_jit_jumpRelative
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,countExtension + (long)(int16_t)pc);
        break;
      case 0x20:
        sysbvm_jit_callWithContext1
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_pointerLikeType_withEmptyBox,
                   (int16_t)pc,pc._2_2_);
        break;
      case 0x21:
        sysbvm_jit_moveOperandToOperand
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,pc._2_2_);
        break;
      case 0x22:
        sysbvm_jit_callWithContext1
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_pointerLikeType_load,(int16_t)pc
                   ,pc._2_2_);
        break;
      case 0x23:
        sysbvm_jit_callWithContext1
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,
                   sysbvm_bytecodeJit_symbolValueBinding_getValue,(int16_t)pc,pc._2_2_);
        break;
      case 0x24:
        sysbvm_jit_callWithContextNoResult2
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_pointerLikeType_store,
                   (int16_t)pc,pc._2_2_);
        break;
      case 0x25:
        if (pc._2_2_ < 0) {
          sysbvm_jit_callWithContextNoResult0
                    ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_gc_safepoint);
        }
        sysbvm_jit_jumpRelativeIfTrue
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,
                   countExtension + (long)pc._2_2_);
        break;
      case 0x26:
        if (pc._2_2_ < 0) {
          sysbvm_jit_callWithContextNoResult0
                    ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_gc_safepoint);
        }
        sysbvm_jit_jumpRelativeIfFalse
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,
                   countExtension + (long)pc._2_2_);
        break;
      case 0x27:
        break;
      case 0x30:
        sysbvm_jit_callWithContext2
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_pointerLikeType_withBoxForValue,
                   (int16_t)pc,pc._2_2_,pc._4_2_);
        break;
      case 0x31:
        sysbvm_jit_callWithContext2
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_type_coerceValue,(int16_t)pc,
                   pc._2_2_,pc._4_2_);
        break;
      case 0x32:
        sysbvm_jit_callWithContext2
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_type_downCastValue,(int16_t)pc,
                   pc._2_2_,pc._4_2_);
        break;
      case 0x33:
        sysbvm_jit_moveOperandToOperand
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,pc._4_2_);
        break;
      case 0x34:
        sysbvm_jit_callWithContext2
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_association_create,(int16_t)pc,
                   pc._2_2_,pc._4_2_);
        break;
      case 0x36:
        sysbvm_jit_callWithContext2
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_bytecodeJit_slotAt,(int16_t)pc,
                   pc._2_2_,pc._4_2_);
        break;
      case 0x37:
        sysbvm_jit_callWithContext2
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_bytecodeJit_slotReferenceAt,
                   (int16_t)pc,pc._2_2_,pc._4_2_);
        break;
      case 0x38:
        sysbvm_jit_callWithContextNoResult3
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_bytecodeJit_slotAtPut,
                   (int16_t)pc,pc._2_2_,pc._4_2_);
        break;
      case 0x39:
        sysbvm_jit_callWithContext2
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_bytecodeJit_refSlotAt,
                   (int16_t)pc,pc._2_2_,pc._4_2_);
        break;
      case 0x3a:
        sysbvm_jit_callWithContext2
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_bytecodeJit_refSlotReferenceAt,
                   (int16_t)pc,pc._2_2_,pc._4_2_);
        break;
      case 0x3b:
        sysbvm_jit_callWithContextNoResult3
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,sysbvm_bytecodeJit_refSlotAtPut,
                   (int16_t)pc,pc._2_2_,pc._4_2_);
        break;
      case 0x40:
        sysbvm_jit_functionApply
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,pc._2_2_,
                   (long)(int)(operandCount._7_1_ & 0xf),(int16_t *)((long)&pc + 4),0);
        break;
      case 0x50:
        sysbvm_jit_functionApply
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,pc._2_2_,
                   (long)(int)(operandCount._7_1_ & 0xf),(int16_t *)((long)&pc + 4),1);
        break;
      case 0x60:
        sysbvm_jit_send((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,pc._2_2_,
                        (long)(int)(operandCount._7_1_ & 0xf),(int16_t *)((long)&pc + 4),0);
        break;
      case 0x70:
        sysbvm_jit_sendWithReceiverType
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,pc._2_2_,pc._4_2_,
                   (long)(int)(operandCount._7_1_ & 0xf),(int16_t *)((long)&pc + 6),0);
        break;
      case 0x80:
        sysbvm_jit_makeArray
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,
                   (long)(int)(operandCount._7_1_ & 0xf),(int16_t *)((long)&pc + 2));
        break;
      case 0x90:
        sysbvm_jit_makeByteArray
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,
                   (long)(int)(operandCount._7_1_ & 0xf),(int16_t *)((long)&pc + 2));
        break;
      case 0xa0:
        sysbvm_jit_makeClosureWithCaptures
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,pc._2_2_,
                   (long)(int)(operandCount._7_1_ & 0xf),(int16_t *)((long)&pc + 4));
        break;
      case 0xb0:
        sysbvm_jit_makeDictionary
                  ((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,
                   (long)(int)(operandCount._7_1_ & 0xf),(int16_t *)((long)&pc + 2));
        break;
      case 0xe0:
        sysbvm_jit_caseJump((sysbvm_bytecodeJit_t *)&instructionsSize,(int16_t)pc,sStack_510,
                            (int16_t *)((long)&pc + 2),decodedOperands + (sStack_510 - 3),
                            decodedOperands[caseCount - 5],countExtension);
      }
    }
  }
  sysbvm_jit_finish((sysbvm_bytecodeJit_t *)&instructionsSize);
  textSectionSize = sysbvm_sizeAlignedTo(jit.objectFileHeader.entrySize,0x10);
  rodataSectionSize = sysbvm_sizeAlignedTo(jit.instructions.entrySize,0x10);
  unwindInfoSize = sysbvm_sizeAlignedTo(jit.constants.entrySize,0x10);
  sVar4 = sysbvm_sizeAlignedTo(jit.unwindInfo.entrySize,0x10);
  sVar9 = sysbvm_sizeAlignedTo(jit.dwarfEhBuilder.buffer.entrySize,0x10);
  debugInfoSize = sVar4 + sVar9;
  sVar4 = sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.line.entrySize,0x10);
  sVar9 = sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.str.entrySize,0x10);
  sVar6 = sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.abbrev.entrySize,0x10);
  sVar7 = sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.info.entrySize,0x10);
  objectFileContentSize = sVar4 + sVar9 + sVar6 + sVar7;
  requiredCodeSize = sysbvm_sizeAlignedTo(jit.objectFileContent.entrySize,0x10);
  codeWriteablePointer =
       (uint8_t *)
       (textSectionSize + rodataSectionSize + unwindInfoSize + debugInfoSize + objectFileContentSize
       + requiredCodeSize);
  codeExecutablePointer = (uint8_t *)0x0;
  entryPointPointer = (uint8_t *)0x0;
  sysbvm_chunkedAllocator_allocateWithDualMapping
            (&(context->heap).codeAllocator,(size_t)codeWriteablePointer,0x10,&codeExecutablePointer
             ,&entryPointPointer);
  _Var3 = sysbvm_virtualMemory_lockCodePagesForWriting
                    (codeExecutablePointer,entryPointPointer,(size_t)codeWriteablePointer);
  if (!_Var3) {
    abort();
  }
  memset(codeExecutablePointer + textSectionSize,0xcc,rodataSectionSize);
  memset(codeExecutablePointer + rodataSectionSize + textSectionSize,0,unwindInfoSize);
  entry = (sysbvm_gdb_jit_code_entry_t *)
          sysbvm_jit_installIn
                    ((sysbvm_bytecodeJit_t *)&instructionsSize,codeExecutablePointer,
                     entryPointPointer);
  sysbvm_virtualMemory_unlockCodePagesForExecution
            (codeExecutablePointer,entryPointPointer,(size_t)codeWriteablePointer);
  if ((jit.objectFileHeader.entrySize != 0) && (jit.objectFileContent.entrySize != 0)) {
    local_588 = (sysbvm_gdb_jit_code_entry_t *)calloc(1,0x20);
    sysbvm_dynarray_add(&context->jittedObjectFileEntries,&local_588);
    sysbvm_gdb_registerObjectFile(local_588,entryPointPointer,(size_t)codeWriteablePointer);
  }
  sVar8 = sysbvm_tuple_systemHandle_encode(context,(sysbvm_systemHandle_t)entry);
  jit.literalVectorGCRoot[0xe] = sVar8;
  jit.literalVectorGCRoot[0x10] = (context->roots).sessionToken;
  sysbvm_jit_patchTrampolineWithRealEntryPoint
            ((sysbvm_bytecodeJit_t *)&instructionsSize,
             (sysbvm_functionBytecode_t *)jit.literalVectorGCRoot);
  sysbvm_bytecodeJit_jitFree((sysbvm_bytecodeJit_t *)&instructionsSize);
  return;
}

Assistant:

SYSBVM_API void sysbvm_bytecodeJit_jit(sysbvm_context_t *context, sysbvm_functionBytecode_t *functionBytecode)
{
    (void)context;
    sysbvm_bytecodeInterpreter_ensureTablesAreFilled();

    sysbvm_bytecodeJit_t jit;
    sysbvm_bytecodeJit_initialize(&jit, context);

    jit.sourcePosition = functionBytecode->sourcePosition;
    jit.compiledProgramEntity = functionBytecode->definition;

    jit.literalVectorGCRoot = sysbvm_heap_allocateGCRootTableEntry(&context->heap);
    *jit.literalVectorGCRoot = functionBytecode->literalVector;

    size_t instructionsSize = sysbvm_tuple_getSizeInBytes(functionBytecode->instructions);
    uint8_t *instructions = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(functionBytecode->instructions)->bytes;

    int16_t decodedOperands[SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE] = {0};
    jit.argumentCount = sysbvm_tuple_size_decode(functionBytecode->argumentCount);
    jit.captureVectorSize = sysbvm_tuple_size_decode(functionBytecode->captureVectorSize);
    jit.literalCount = sysbvm_tuple_getSizeInSlots(functionBytecode->literalVector);
    jit.localVectorSize = sysbvm_tuple_size_decode(functionBytecode->localVectorSize);

    jit.pcDestinations = (intptr_t*)malloc(sizeof(intptr_t)*instructionsSize);
    memset(jit.pcDestinations, -1, sizeof(intptr_t)*instructionsSize);

    sysbvm_jit_prologue(&jit);

    size_t pc = 0;
    size_t countExtension = 0;
    while(pc < instructionsSize)
    {
        jit.pcDestinations[pc] = jit.instructions.size;
        sysbvm_jit_storePC(&jit, (uint16_t)pc);

        sysbvm_bytecodeJit_addSourcePositionRecord(&jit, functionBytecode, (uint16_t)pc, jit.instructions.size);

        uint8_t opcode = instructions[pc++];
        if(opcode == SYSBVM_OPCODE_COUNT_EXTENSION)
        {
            uint8_t lowByte = instructions[pc++];
            uint8_t highByte = instructions[pc++];
            countExtension = (countExtension << 16) | (highByte << 8) | lowByte;
            continue;
        }

        uint8_t standardOpcode = opcode;
        size_t operandCount = 0;
        size_t caseCount = 0;
        if(opcode >= SYSBVM_OPCODE_FIRST_VARIABLE)
        {
            operandCount = (countExtension << 4) + (opcode & 0x0F);
            standardOpcode = opcode & 0xF0;
            if(standardOpcode == SYSBVM_OPCODE_CASE_JUMP)
            {
                caseCount = operandCount;
                operandCount *= 2;
            }

            operandCount += sysbvm_implicitVariableBytecodeOperandCountTable[opcode >> 4];
        }
        else
        {
            operandCount = opcode >> 4;
        }
        countExtension = 0;

        // Decode the operands.
        SYSBVM_ASSERT(operandCount < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE);
        SYSBVM_ASSERT(pc + operandCount*2 <= instructionsSize);
        for(uint8_t i = 0; i < operandCount; ++i)
        {
            uint16_t lowByte = instructions[pc++];
            uint16_t highByte = instructions[pc++];
            decodedOperands[i] = lowByte | (highByte << 8);
        }

        // Validate the destination operands.
        uint8_t destinationOperandCount = sysbvm_bytecodeInterpreter_destinationOperandCountForOpcode(standardOpcode);
        size_t offsetOperandCount = caseCount + sysbvm_bytecodeInterpreter_offsetOperandCountForOpcode(standardOpcode);

        for(uint8_t i = 0; i < destinationOperandCount; ++i)
        {
            if((decodedOperands[i] & SYSBVM_OPERAND_VECTOR_BITMASK) != SYSBVM_OPERAND_VECTOR_LOCAL)
                sysbvm_error("Bytecode destination operands must be in the local vector.");
            
            int16_t vectorIndex = decodedOperands[i] >> SYSBVM_OPERAND_VECTOR_BITS;
            if(vectorIndex >= 0 && (size_t)vectorIndex >= jit.localVectorSize)
                sysbvm_error("Bytecode destination operand is beyond the local vector bounds.");
        }

        // Fetch the source operands.
        for(uint8_t i = destinationOperandCount; i < operandCount - offsetOperandCount; ++i)
        {
            SYSBVM_ASSERT(i < SYSBVM_BYTECODE_FUNCTION_OPERAND_REGISTER_FILE_SIZE);

            int16_t decodedOperand = decodedOperands[i];
            int16_t vectorIndex = decodedOperand >> SYSBVM_OPERAND_VECTOR_BITS;
            uint8_t vectorType = decodedOperand & SYSBVM_OPERAND_VECTOR_BITMASK;
            switch(vectorType)
            {
            case SYSBVM_OPERAND_VECTOR_ARGUMENTS:
                if((size_t)vectorIndex >= jit.argumentCount)
                    sysbvm_error("Bytecode operand is beyond the argument vector bounds.");
                break;
            case SYSBVM_OPERAND_VECTOR_CAPTURES:
                if((size_t)vectorIndex >= jit.captureVectorSize)
                    sysbvm_error("Bytecode operand is beyond the capture vector bounds.");
                break;
            case SYSBVM_OPERAND_VECTOR_LITERAL:
                if((size_t)vectorIndex >= jit.literalCount)
                    sysbvm_error("Bytecode operand is beyond the literal vector bounds.");
                break;
            case SYSBVM_OPERAND_VECTOR_LOCAL:
                if((size_t)vectorIndex >= jit.localVectorSize)
                    sysbvm_error("Bytecode operand is beyond the local vector bounds.");
                break;
            default:
                abort();
            }
        }

        // Execute the opcodes.
        switch(standardOpcode)
        {
        // Zero operands
        case SYSBVM_OPCODE_NOP:
            // Nothing is required here.
            break;
        case SYSBVM_OPCODE_BREAKPOINT:
            // Nothing is required here.
            sysbvm_jit_breakpoint(&jit);
            break;
        case SYSBVM_OPCODE_UNREACHABLE:
            // Nothing is required here.
            sysbvm_jit_unreachable(&jit);
            break;
        
        // One operands
        case SYSBVM_OPCODE_RETURN:
            sysbvm_jit_return(&jit, decodedOperands[0]);
            break;
        case SYSBVM_OPCODE_JUMP:
            if(decodedOperands[0] < 0)
                sysbvm_jit_callWithContextNoResult0(&jit, &sysbvm_gc_safepoint);
            sysbvm_jit_jumpRelative(&jit, pc + decodedOperands[0]);
            break;
        // Two operands.
        case SYSBVM_OPCODE_ALLOCA:
            sysbvm_jit_callWithContext1(&jit, &sysbvm_pointerLikeType_withEmptyBox, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_LOAD:
            sysbvm_jit_callWithContext1(&jit, &sysbvm_pointerLikeType_load, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_LOAD_SYMBOL_VALUE_BINDING:
            sysbvm_jit_callWithContext1(&jit, &sysbvm_bytecodeJit_symbolValueBinding_getValue, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_STORE:
            sysbvm_jit_callWithContextNoResult2(&jit, &sysbvm_pointerLikeType_store, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_MOVE:
            sysbvm_jit_moveOperandToOperand(&jit, decodedOperands[0], decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_JUMP_IF_TRUE:
            if(decodedOperands[1] < 0)
                sysbvm_jit_callWithContextNoResult0(&jit, &sysbvm_gc_safepoint);
            sysbvm_jit_jumpRelativeIfTrue(&jit, decodedOperands[0], pc + decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_JUMP_IF_FALSE:
            if(decodedOperands[1] < 0)
                sysbvm_jit_callWithContextNoResult0(&jit, &sysbvm_gc_safepoint);
            sysbvm_jit_jumpRelativeIfFalse(&jit, decodedOperands[0], pc + decodedOperands[1]);
            break;
        case SYSBVM_OPCODE_SET_DEBUG_VALUE:
            // NOP
            break;

        // Three operands.
        case SYSBVM_OPCODE_ALLOCA_WITH_VALUE:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_pointerLikeType_withBoxForValue, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_COERCE_VALUE:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_type_coerceValue, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_DOWNCAST_VALUE:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_type_downCastValue, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_UNCHECKED_DOWNCAST_VALUE:
            sysbvm_jit_moveOperandToOperand(&jit, decodedOperands[0], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_MAKE_ASSOCIATION:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_association_create, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_SLOT_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_slotAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_SLOT_AT_PUT:
            sysbvm_jit_callWithContextNoResult3(&jit, &sysbvm_bytecodeJit_slotAtPut, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_SLOT_REFERENCE_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_slotReferenceAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_REF_SLOT_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_refSlotAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_REF_SLOT_AT_PUT:
            sysbvm_jit_callWithContextNoResult3(&jit, &sysbvm_bytecodeJit_refSlotAtPut, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;
        case SYSBVM_OPCODE_REF_SLOT_REFERENCE_AT:
            sysbvm_jit_callWithContext2(&jit, &sysbvm_bytecodeJit_refSlotReferenceAt, decodedOperands[0], decodedOperands[1], decodedOperands[2]);
            break;

        // Variable operand.
        case SYSBVM_OPCODE_CALL:
            sysbvm_jit_functionApply(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2, 0);
            break;
        case SYSBVM_OPCODE_UNCHECKED_CALL:
            sysbvm_jit_functionApply(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2, SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK);
            break;
        case SYSBVM_OPCODE_SEND:
            sysbvm_jit_send(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2, 0);
            break;
        case SYSBVM_OPCODE_SEND_WITH_LOOKUP:
            sysbvm_jit_sendWithReceiverType(&jit, decodedOperands[0], decodedOperands[1], decodedOperands[2], opcode & 0xF, decodedOperands + 3, 0);
            break;
        case SYSBVM_OPCODE_MAKE_ARRAY_WITH_ELEMENTS:
            sysbvm_jit_makeArray(&jit, decodedOperands[0], opcode & 0xF, decodedOperands + 1);
            break;
        case SYSBVM_OPCODE_MAKE_BYTE_ARRAY_WITH_ELEMENTS:
            sysbvm_jit_makeByteArray(&jit, decodedOperands[0], opcode & 0xF, decodedOperands + 1);
            break;
        case SYSBVM_OPCODE_MAKE_CLOSURE_WITH_CAPTURES:
            sysbvm_jit_makeClosureWithCaptures(&jit, decodedOperands[0], decodedOperands[1], opcode & 0xF, decodedOperands + 2);
            break;
        case SYSBVM_OPCODE_MAKE_DICTIONARY_WITH_ELEMENTS:
            sysbvm_jit_makeDictionary(&jit, decodedOperands[0], opcode & 0xF, decodedOperands + 1);
            break;

        case SYSBVM_OPCODE_CASE_JUMP:
            sysbvm_jit_caseJump(&jit, decodedOperands[0], caseCount, decodedOperands + 1, decodedOperands + 1 + caseCount, decodedOperands[operandCount - 1], pc);
            break;
        default:
            sysbvm_error("Unsupported bytecode instruction.");
            break;
        }
    }

    sysbvm_jit_finish(&jit);

    size_t objectFileHeaderSize = sysbvm_sizeAlignedTo(jit.objectFileHeader.size, 16);
    size_t textSectionSize = sysbvm_sizeAlignedTo(jit.instructions.size, 16);
    size_t rodataSectionSize = sysbvm_sizeAlignedTo(jit.constants.size, 16);
    size_t unwindInfoSize = sysbvm_sizeAlignedTo(jit.unwindInfo.size, 16)  + sysbvm_sizeAlignedTo(jit.dwarfEhBuilder.buffer.size, 16);
    size_t debugInfoSize = sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.line.size, 16)
        + sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.str.size, 16)
        + sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.abbrev.size, 16)
        + sysbvm_sizeAlignedTo(jit.dwarfDebugInfoBuilder.info.size, 16);
    size_t objectFileContentSize = sysbvm_sizeAlignedTo(jit.objectFileContent.size, 16);

    size_t requiredCodeSize = objectFileHeaderSize + textSectionSize + rodataSectionSize + unwindInfoSize + debugInfoSize + objectFileContentSize;
    uint8_t *codeWriteablePointer = NULL;
    uint8_t *codeExecutablePointer = NULL;
    sysbvm_chunkedAllocator_allocateWithDualMapping(&context->heap.codeAllocator, requiredCodeSize, 16, (void**)&codeWriteablePointer, (void**)&codeExecutablePointer);
    if(!sysbvm_virtualMemory_lockCodePagesForWriting(codeWriteablePointer, codeExecutablePointer, requiredCodeSize))
        abort();

    memset(codeWriteablePointer + objectFileHeaderSize, 0xcc, textSectionSize); // int3;
    memset(codeWriteablePointer + objectFileHeaderSize + textSectionSize, 0, rodataSectionSize); // int3;
    uint8_t *entryPointPointer = sysbvm_jit_installIn(&jit, codeWriteablePointer, codeExecutablePointer);
    sysbvm_virtualMemory_unlockCodePagesForExecution(codeWriteablePointer, codeExecutablePointer, requiredCodeSize);

    // Register the object file with gdb.
    if(jit.objectFileHeader.size > 0 && jit.objectFileContent.size > 0)
    {
        sysbvm_gdb_jit_code_entry_t *entry = (sysbvm_gdb_jit_code_entry_t*)calloc(1, sizeof(sysbvm_gdb_jit_code_entry_t));
        sysbvm_dynarray_add(&context->jittedObjectFileEntries, &entry);
        sysbvm_gdb_registerObjectFile(entry, codeExecutablePointer, requiredCodeSize);
    }

    functionBytecode->jittedCode = sysbvm_tuple_systemHandle_encode(context, (sysbvm_systemHandle_t)(uintptr_t)entryPointPointer);
    functionBytecode->jittedCodeSessionToken = context->roots.sessionToken;

    // Patch the trampoline.
    sysbvm_jit_patchTrampolineWithRealEntryPoint(&jit, functionBytecode);

    sysbvm_bytecodeJit_jitFree(&jit);
}